

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plane_mixer.c
# Opt level: O3

void calculate_pitch_shift(space_source *source,space_mixer_data *listener)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar2 = listener->doppler_factor;
  if (fVar2 <= 0.0) {
    fVar2 = 1.0;
  }
  else {
    fVar7 = listener->location[0] - source->location[0];
    fVar9 = listener->location[1] - source->location[1];
    fVar3 = listener->location[2] - source->location[2];
    fVar1 = listener->soundspeed;
    fVar4 = SQRT(fVar3 * fVar3 + fVar7 * fVar7 + fVar9 * fVar9);
    fVar8 = fVar1 / fVar2;
    auVar5._0_4_ = fVar4 * (listener->velocity[2] * fVar3 +
                           listener->velocity[0] * fVar7 + listener->velocity[1] * fVar9);
    auVar5._4_4_ = fVar4 * (source->velocity[2] * fVar3 +
                           source->velocity[0] * fVar7 + source->velocity[1] * fVar9);
    auVar5._8_4_ = fVar4 * (fVar3 * 0.0 + fVar7 * 0.0 + fVar9 * 0.0);
    auVar5._12_4_ = fVar4 * (fVar3 * 0.0 + fVar7 * 0.0 + fVar9 * 0.0);
    auVar6._4_4_ = fVar8;
    auVar6._0_4_ = fVar8;
    auVar6._8_4_ = fVar8;
    auVar6._12_4_ = fVar8;
    auVar6 = minps(auVar5,auVar6);
    fVar1 = (fVar1 - fVar2 * auVar6._0_4_) / (fVar1 - fVar2 * auVar6._4_4_);
    fVar2 = 0.5;
    if ((0.5 <= fVar1) && (fVar2 = 2.0, fVar1 < 2.0)) {
      fVar2 = fVar1;
    }
  }
  source->pitch = fVar2;
  return;
}

Assistant:

VECTORIZE static inline float calculate_pitch_shift(struct plane_mixer_data *listener, struct plane_source *source){
  if(listener->doppler_factor <= 0.0) return 1.0;
  // See OpenAL1.1 specification §3.5.2
  float SL[2] = {listener->location[0] - source->location[0],
                 listener->location[1] - source->location[1]};
  float *SV = source->velocity;
  float *LV = listener->velocity;
  float SS = listener->soundspeed;
  float DF = listener->doppler_factor;
  float Mag = mag(SL);
  float vls = dot(SL, LV) * Mag;
  float vss = dot(SL, SV) * Mag;
  float SS_DF = SS/DF;
  vss = min(vss, SS_DF);
  vls = min(vls, SS_DF);
  return (SS - DF*vls) / (SS - DF*vss);
}